

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::convertLoadedBoolInUniformToUint
          (TGlslangToSpvTraverser *this,TType *type,Id nominalTypeId,Id loadedId)

{
  bool bVar1;
  uint size;
  Id IVar2;
  Id IVar3;
  int iVar4;
  SpvVersion *pSVar5;
  Id local_fc;
  Id local_f8;
  Id elementConvertedValue;
  Id elementValue;
  int index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> constituents;
  undefined1 local_d0 [4];
  Id elementNominalTypeId;
  TType glslangElementType;
  Id boolArrayTypeId;
  Id bvecType;
  int vecSize;
  Id boolType;
  Id loadedId_local;
  Id nominalTypeId_local;
  TType *type_local;
  TGlslangToSpvTraverser *this_local;
  
  bVar1 = spv::Builder::isScalarType(&this->builder,nominalTypeId);
  vecSize = loadedId;
  if (bVar1) {
    IVar3 = spv::Builder::makeBoolType(&this->builder);
    if (nominalTypeId != IVar3) {
      IVar2 = spv::Builder::makeUintConstant(&this->builder,0,false);
      IVar3 = spv::Builder::createBinOp(&this->builder,OpINotEqual,IVar3,loadedId,IVar2);
      return IVar3;
    }
  }
  else {
    bVar1 = spv::Builder::isVectorType(&this->builder,nominalTypeId);
    if (bVar1) {
      size = spv::Builder::getNumTypeComponents(&this->builder,nominalTypeId);
      IVar3 = spv::Builder::makeBoolType(&this->builder);
      IVar3 = spv::Builder::makeVectorType(&this->builder,IVar3,size);
      if (nominalTypeId != IVar3) {
        glslangElementType.spirvType._4_4_ = IVar3;
        IVar2 = spv::Builder::makeUintConstant(&this->builder,0,false);
        IVar2 = makeSmearedConstant(this,IVar2,size);
        vecSize = spv::Builder::createBinOp(&this->builder,OpINotEqual,IVar3,loadedId,IVar2);
      }
    }
    else {
      bVar1 = spv::Builder::isArrayType(&this->builder,nominalTypeId);
      if ((bVar1) &&
         (glslangElementType.spirvType._0_4_ = convertGlslangToSpvType(this,type,false),
         nominalTypeId != (Id)glslangElementType.spirvType)) {
        pSVar5 = glslang::TIntermediate::getSpv(this->glslangIntermediate);
        if (0x103ff < pSVar5->spv) {
          IVar3 = spv::Builder::createUnaryOp
                            (&this->builder,OpCopyLogical,(Id)glslangElementType.spirvType,loadedId)
          ;
          return IVar3;
        }
        glslang::TType::TType((TType *)local_d0,type,0,false);
        constituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             spv::Builder::getContainedTypeId(&this->builder,nominalTypeId);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&elementValue);
        for (elementConvertedValue = 0; IVar3 = elementConvertedValue,
            iVar4 = (*type->_vptr_TType[0xf])(), (int)IVar3 < iVar4;
            elementConvertedValue = elementConvertedValue + 1) {
          local_f8 = spv::Builder::createCompositeExtract
                               (&this->builder,loadedId,
                                constituents.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                elementConvertedValue);
          local_fc = convertLoadedBoolInUniformToUint
                               (this,(TType *)local_d0,
                                constituents.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,local_f8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&elementValue,&local_fc)
          ;
        }
        IVar3 = spv::Builder::createCompositeConstruct
                          (&this->builder,(Id)glslangElementType.spirvType,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&elementValue);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&elementValue);
        glslang::TType::~TType((TType *)local_d0);
        return IVar3;
      }
    }
  }
  return vecSize;
}

Assistant:

spv::Id TGlslangToSpvTraverser::convertLoadedBoolInUniformToUint(const glslang::TType& type,
                                                                 spv::Id nominalTypeId,
                                                                 spv::Id loadedId)
{
    if (builder.isScalarType(nominalTypeId)) {
        // Conversion for bool
        spv::Id boolType = builder.makeBoolType();
        if (nominalTypeId != boolType)
            return builder.createBinOp(spv::OpINotEqual, boolType, loadedId, builder.makeUintConstant(0));
    } else if (builder.isVectorType(nominalTypeId)) {
        // Conversion for bvec
        int vecSize = builder.getNumTypeComponents(nominalTypeId);
        spv::Id bvecType = builder.makeVectorType(builder.makeBoolType(), vecSize);
        if (nominalTypeId != bvecType)
            loadedId = builder.createBinOp(spv::OpINotEqual, bvecType, loadedId,
                makeSmearedConstant(builder.makeUintConstant(0), vecSize));
    } else if (builder.isArrayType(nominalTypeId)) {
        // Conversion for bool array
        spv::Id boolArrayTypeId = convertGlslangToSpvType(type);
        if (nominalTypeId != boolArrayTypeId)
        {
            // Use OpCopyLogical from SPIR-V 1.4 if available.
            if (glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_4)
                return builder.createUnaryOp(spv::OpCopyLogical, boolArrayTypeId, loadedId);

            glslang::TType glslangElementType(type, 0);
            spv::Id elementNominalTypeId = builder.getContainedTypeId(nominalTypeId);
            std::vector<spv::Id> constituents;
            for (int index = 0; index < type.getOuterArraySize(); ++index) {
                // get the element
                spv::Id elementValue = builder.createCompositeExtract(loadedId, elementNominalTypeId, index);

                // recursively convert it
                spv::Id elementConvertedValue = convertLoadedBoolInUniformToUint(glslangElementType, elementNominalTypeId, elementValue);
                constituents.push_back(elementConvertedValue);
            }
            return builder.createCompositeConstruct(boolArrayTypeId, constituents);
        }
    }

    return loadedId;
}